

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Node __thiscall xt::vector::newPath(vector *this,uint level,Node *node)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Node *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Node NVar3;
  shared_ptr<xt::_Node> local_60;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_50;
  Object local_40;
  
  if (level == 0) {
    peVar1 = (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)this = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
    (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  }
  else {
    this_00 = (_Node *)operator_new(0x10);
    _Node::_Node(this_00);
    std::__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_Node,void>
              ((__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
    std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
    newPath((vector *)&local_60,level - 5,(Node *)&local_50);
    Object::Object<xt::_Node>(&local_40,&local_60);
    Object::operator=(*(Object **)**(undefined8 **)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_60.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    node = (Node *)extraout_RDX;
  }
  NVar3.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  NVar3.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar3.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node newPath(unsigned int level, Node node) {
	if (level == 0) return node;
	Node ret = Node(new _Node);
	(*ret->array)[0] = newPath(level - 5, node);
	return ret;
}